

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O3

bool __thiscall FTraceInfo::LineCheck(FTraceInfo *this,intercept_t *in,double dist,DVector3 *hit)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  ETraceResult EVar11;
  uint uVar12;
  extsector_t *peVar13;
  F3DFloor **ppFVar14;
  F3DFloor *pFVar15;
  double dVar16;
  double dVar17;
  splane *psVar18;
  bool bVar19;
  uint side;
  ETraceStatus EVar20;
  sector_t_conflict *psVar21;
  FTraceResults *pFVar22;
  ulong uVar23;
  BYTE BVar24;
  int iVar25;
  uint uVar26;
  sector_t_conflict *psVar27;
  secplane_t *psVar28;
  AActor *mo;
  long lVar29;
  line_t_conflict *plVar30;
  uint *puVar31;
  long lVar32;
  ulong uVar33;
  double dVar34;
  double dVar35;
  double local_78;
  double local_68;
  double dStack_60;
  
  plVar30 = (in->d).line;
  psVar27 = plVar30->frontsector;
  psVar21 = this->CurSector;
  side = 0;
  if (psVar27->sectornum != psVar21->sectornum) {
    if (plVar30->backsector == (sector_t_conflict *)0x0) {
      side = 0;
    }
    else {
      side = 1;
      if (plVar30->backsector->sectornum == psVar21->sectornum) goto LAB_0045dea1;
      dVar1 = (this->Start).X;
      dVar2 = (this->Start).Y;
      if (((byte)i_compatflags2 & 8) == 0) {
        side = (uint)(1.52587890625e-05 <
                     (plVar30->delta).Y * ((plVar30->v1->p).X - dVar1) +
                     (plVar30->delta).X * (dVar2 - (plVar30->v1->p).Y));
      }
      else {
        side = P_VanillaPointOnLineSide(dVar1,dVar2,(line_t *)plVar30);
      }
      psVar27 = (sector_t_conflict *)(&((in->d).thing)->SpriteAngle)[side != 0].Degrees;
    }
    this->CurSector = psVar27;
    psVar21 = psVar27;
  }
LAB_0045dea1:
  plVar30 = (in->d).line;
  if ((plVar30->flags & 4) == 0) {
    psVar27 = (sector_t_conflict *)0x0;
  }
  else {
    psVar27 = (sector_t_conflict *)plVar30->bbox[(ulong)(side == 0) + 4];
    if (((i_compatflags._1_1_ & 0x20) != 0) && (plVar30->backsector == plVar30->frontsector)) {
      uVar26 = this->TraceFlags;
      if ((uVar26 & 2) != 0) {
        P_ActivateLine(plVar30,this->IgnoreThis,side,0x20,(DVector3 *)0x0);
        uVar26 = this->TraceFlags;
      }
      if ((uVar26 & 4) != 0) {
        P_ActivateLine((in->d).line,this->IgnoreThis,side,8,(DVector3 *)0x0);
        return true;
      }
      return true;
    }
  }
  dVar1 = hit->X;
  dVar2 = (psVar21->floorplane).normal.X;
  dVar35 = (psVar21->floorplane).D;
  dVar34 = hit->Y;
  dVar3 = (psVar21->floorplane).normal.Y;
  dVar4 = (psVar21->ceilingplane).normal.X;
  dVar5 = (psVar21->ceilingplane).D;
  dVar6 = (psVar21->ceilingplane).normal.Y;
  if (psVar27 == (sector_t_conflict *)0x0) {
    local_68 = 0.0;
    dStack_60 = 0.0;
  }
  else {
    local_68 = (psVar27->ceilingplane).negiC *
               ((psVar27->ceilingplane).normal.Y * dVar34 +
               (psVar27->ceilingplane).D + (psVar27->ceilingplane).normal.X * dVar1);
    dStack_60 = (psVar27->floorplane).negiC *
                ((psVar27->floorplane).normal.Y * dVar34 +
                (psVar27->floorplane).D + (psVar27->floorplane).normal.X * dVar1);
  }
  dVar7 = (psVar21->floorplane).negiC;
  dVar8 = (psVar21->ceilingplane).negiC;
  psVar21 = sector_t::GetHeightSec(psVar21);
  if ((psVar21 != (sector_t_conflict *)0x0) && (this->Results->CrossedWater == (sector_t *)0x0)) {
    dVar9 = (psVar21->floorplane).D;
    dVar16 = (psVar21->floorplane).normal.X;
    dVar17 = (psVar21->floorplane).normal.Y;
    dVar10 = (psVar21->floorplane).negiC;
    if ((((this->Start).Y * dVar17 + dVar9 + (this->Start).X * dVar16) * dVar10 < (this->Start).Z)
       && ((hit->Z <= dVar10 * (dVar17 * hit->Y + dVar9 + dVar16 * hit->X) &&
           (bVar19 = CheckPlane(this,&psVar21->floorplane), bVar19)))) {
      pFVar22 = this->Results;
      pFVar22->CrossedWater = (sector_t *)(sectors + this->CurSector->sectornum);
      (pFVar22->CrossedWaterPos).Z = (pFVar22->HitPos).Z;
      dVar9 = (pFVar22->HitPos).Y;
      (pFVar22->CrossedWaterPos).X = (pFVar22->HitPos).X;
      (pFVar22->CrossedWaterPos).Y = dVar9;
      pFVar22->Distance = 0.0;
    }
  }
  dVar9 = hit->Z;
  if (dVar9 <= (dVar3 * dVar34 + dVar2 * dVar1 + dVar35) * dVar7) {
    pFVar22 = this->Results;
    pFVar22->HitType = TRACE_HitFloor;
    iVar25 = this->CurSector->planes[0].Texture.texnum;
LAB_0045e144:
    (pFVar22->HitTexture).texnum = iVar25;
  }
  else {
    if ((dVar6 * dVar34 + dVar4 * dVar1 + dVar5) * dVar8 <= dVar9) {
      pFVar22 = this->Results;
      pFVar22->HitType = TRACE_HitCeiling;
      iVar25 = this->CurSector->planes[1].Texture.texnum;
      goto LAB_0045e144;
    }
    if (((psVar27 == (sector_t_conflict *)0x0) || (dVar9 < dStack_60)) || (local_68 < dVar9)) {
      pFVar22 = this->Results;
      pFVar22->HitType = TRACE_HitWall;
      if (psVar27 != (sector_t_conflict *)0x0) goto LAB_0045e215;
      BVar24 = '\0';
LAB_0045e6db:
      pFVar22->Tier = BVar24;
      if ((this->TraceFlags & 4) != 0) {
        plVar30 = (in->d).line;
        mo = this->IgnoreThis;
        local_78 = dStack_60;
LAB_0045e703:
        P_ActivateLine(plVar30,mo,side,8,(DVector3 *)0x0);
        dStack_60 = local_78;
      }
    }
    else {
      if ((((in->d).line)->flags & this->WallMask) != 0) {
        pFVar22 = this->Results;
        pFVar22->HitType = TRACE_HitWall;
LAB_0045e215:
        BVar24 = '\x02';
        if (dStack_60 < dVar9) {
          BVar24 = local_68 <= dVar9;
        }
        goto LAB_0045e6db;
      }
      if ((psVar27->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
        memcpy(this->DummySector + this->sectorsel,psVar27,0x218);
        uVar26 = this->sectorsel;
        psVar27 = this->DummySector + (int)uVar26;
        this->sectorsel = uVar26 ^ 1;
        peVar13 = this->DummySector[(int)uVar26].e;
        uVar23 = (ulong)(peVar13->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
        if (uVar23 != 0) {
          ppFVar14 = (peVar13->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
          uVar12 = this->inshootthrough;
          lVar32 = 0;
          do {
            pFVar15 = *(F3DFloor **)((long)ppFVar14 + lVar32);
            if (((pFVar15->flags & 1) != 0) && ((pFVar15->flags >> 0x1a & 1) != uVar12)) {
              psVar28 = (pFVar15->top).plane;
              dVar1 = (psVar28->normal).X;
              dVar2 = (psVar28->normal).Y;
              dVar35 = (hit->Y * dVar2 + psVar28->D + hit->X * dVar1) * psVar28->negiC;
              if (hit->Z <= dVar35) {
                psVar28 = (pFVar15->bottom).plane;
                dVar1 = (psVar28->normal).X;
                dVar2 = (psVar28->normal).Y;
                dVar34 = (hit->Y * dVar2 + psVar28->D + hit->X * dVar1) * psVar28->negiC;
                if (dVar34 <= hit->Z) {
                  pFVar22 = this->Results;
                  pFVar22->HitType = TRACE_HitWall;
                  pFVar22->Tier = '\x03';
                  pFVar22->ffloor = pFVar15;
                  if (((this->TraceFlags & 4) == 0) ||
                     (plVar30 = (in->d).line, plVar30->special == 0)) goto LAB_0045e151;
                  mo = this->IgnoreThis;
                  local_78 = dStack_60;
                  goto LAB_0045e703;
                }
                if (ABS(local_68 - dVar34) < 1.52587890625e-05) {
                  dVar35 = this->DummySector[(int)uVar26].centerspot.X;
                  dVar3 = this->DummySector[(int)uVar26].centerspot.Y;
                  uVar33 = -(ulong)(psVar28->negiC * (dVar3 * dVar2 + dVar35 * dVar1 + psVar28->D) <
                                   this->DummySector[(int)uVar26].ceilingplane.negiC *
                                   (this->DummySector[(int)uVar26].ceilingplane.normal.Y * dVar3 +
                                   this->DummySector[(int)uVar26].ceilingplane.normal.X * dVar35 +
                                   this->DummySector[(int)uVar26].ceilingplane.D));
                  local_68 = (double)(~uVar33 & (ulong)local_68 |
                                     (ulong)(dVar34 + 1.52587890625e-05) & uVar33);
                }
                if (dVar34 < local_68) {
                  this->DummySector[(int)uVar26].ceilingplane.normal.Z = (psVar28->normal).Z;
                  this->DummySector[(int)uVar26].ceilingplane.normal.X = dVar1;
                  this->DummySector[(int)uVar26].ceilingplane.normal.Y = dVar2;
                  dVar1 = psVar28->negiC;
                  this->DummySector[(int)uVar26].ceilingplane.D = psVar28->D;
                  this->DummySector[(int)uVar26].ceilingplane.negiC = dVar1;
                  lVar29 = 8;
                  puVar31 = this->DummySector[(int)uVar26].Portals + 1;
                  psVar18 = this->DummySector[(int)uVar26].planes + 1;
                  goto LAB_0045e6ba;
                }
              }
              else {
                if (ABS(dStack_60 - dVar35) < 1.52587890625e-05) {
                  dVar34 = this->DummySector[(int)uVar26].centerspot.X;
                  dVar3 = this->DummySector[(int)uVar26].centerspot.Y;
                  uVar33 = -(ulong)(this->DummySector[(int)uVar26].floorplane.negiC *
                                    (this->DummySector[(int)uVar26].floorplane.normal.Y * dVar3 +
                                    this->DummySector[(int)uVar26].floorplane.normal.X * dVar34 +
                                    this->DummySector[(int)uVar26].floorplane.D) <
                                   psVar28->negiC * (dVar3 * dVar2 + dVar34 * dVar1 + psVar28->D));
                  dStack_60 = (double)(~uVar33 & (ulong)dStack_60 |
                                      (ulong)(dVar35 + -1.52587890625e-05) & uVar33);
                }
                if (dStack_60 < dVar35) {
                  this->DummySector[(int)uVar26].floorplane.normal.Z = (psVar28->normal).Z;
                  this->DummySector[(int)uVar26].floorplane.normal.X = dVar1;
                  this->DummySector[(int)uVar26].floorplane.normal.Y = dVar2;
                  dVar1 = psVar28->negiC;
                  this->DummySector[(int)uVar26].floorplane.D = psVar28->D;
                  this->DummySector[(int)uVar26].floorplane.negiC = dVar1;
                  lVar29 = 0x30;
                  puVar31 = this->DummySector[(int)uVar26].Portals;
                  dVar34 = local_68;
                  dStack_60 = dVar35;
                  psVar18 = this->DummySector[(int)uVar26].planes;
LAB_0045e6ba:
                  (psVar18->Texture).texnum = **(int **)((long)&(pFVar15->bottom).plane + lVar29);
                  *puVar31 = 0;
                  local_68 = dVar34;
                }
              }
            }
            lVar32 = lVar32 + 8;
          } while (uVar23 << 3 != lVar32);
        }
      }
      this->Results->HitType = TRACE_HitNone;
      uVar26 = this->TraceFlags;
      if ((uVar26 & 2) != 0) {
        P_ActivateLine((in->d).line,this->IgnoreThis,side,0x20,(DVector3 *)0x0);
        uVar26 = this->TraceFlags;
      }
      if ((uVar26 & 4) != 0) {
        plVar30 = (in->d).line;
        mo = this->IgnoreThis;
        local_78 = dStack_60;
        goto LAB_0045e703;
      }
    }
  }
LAB_0045e151:
  pFVar22 = this->Results;
  EVar11 = pFVar22->HitType;
  if (EVar11 == TRACE_HitNone) goto LAB_0045e31c;
  psVar21 = this->CurSector;
  pFVar22->Sector = (sector_t *)(sectors + psVar21->sectornum);
  if (EVar11 != TRACE_HitWall) {
    psVar28 = &psVar21->floorplane;
    if (EVar11 != TRACE_HitFloor) {
      psVar28 = &psVar21->ceilingplane;
    }
    bVar19 = CheckPlane(this,psVar28);
    if (!bVar19) {
      if (psVar27 == (sector_t_conflict *)0x0) {
        pFVar22 = this->Results;
        pFVar22->HitType = TRACE_HitWall;
        BVar24 = '\0';
      }
      else {
        dVar1 = hit->Z;
        pFVar22 = this->Results;
        if ((dStack_60 < dVar1) && (dVar1 < local_68)) {
          pFVar22->HitType = TRACE_HitNone;
          goto LAB_0045e2cc;
        }
        pFVar22->HitType = TRACE_HitWall;
        BVar24 = '\x02';
        if (dStack_60 < dVar1) {
          BVar24 = local_68 <= dVar1;
        }
      }
      pFVar22->Tier = BVar24;
      if ((this->TraceFlags & 4) != 0) {
        P_ActivateLine((in->d).line,this->IgnoreThis,side,8,(DVector3 *)0x0);
      }
    }
  }
LAB_0045e2cc:
  pFVar22 = this->Results;
  if (pFVar22->HitType == TRACE_HitWall) {
    (pFVar22->HitPos).Z = hit->Z;
    dVar1 = hit->Y;
    (pFVar22->HitPos).X = hit->X;
    (pFVar22->HitPos).Y = dVar1;
    SetSourcePosition(this);
    pFVar22 = this->Results;
    pFVar22->Distance = dist;
    pFVar22->Fraction = in->frac;
    pFVar22->Line = (line_t *)in->d;
    pFVar22->Side = (BYTE)side;
  }
LAB_0045e31c:
  if ((this->TraceCallback != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0) &&
     (pFVar22->HitType != TRACE_HitNone)) {
    EVar20 = (*this->TraceCallback)(pFVar22,this->TraceCallbackData);
    if (EVar20 == TRACE_Stop) {
      return false;
    }
    if (EVar20 == TRACE_Skip) {
      pFVar22 = this->Results;
      pFVar22->HitType = TRACE_HitNone;
    }
    else {
      if (EVar20 == TRACE_Abort) {
        this->Results->HitType = TRACE_HitNone;
        return false;
      }
      pFVar22 = this->Results;
    }
  }
  if (pFVar22->HitType != TRACE_HitNone) {
    return false;
  }
  this->CurSector = psVar27;
  this->EnterDist = dist;
  return true;
}

Assistant:

bool FTraceInfo::LineCheck(intercept_t *in, double dist, DVector3 hit)
{
	int lineside;
	sector_t *entersector;

	double ff, fc, bf = 0, bc = 0;

	if (in->d.line->frontsector->sectornum == CurSector->sectornum)
	{
		lineside = 0;
	}
	else if (in->d.line->backsector && in->d.line->backsector->sectornum == CurSector->sectornum)
	{
		lineside = 1;
	}
	else
	{ // Dammit. Why does Doom have to allow non-closed sectors?
		if (in->d.line->backsector == NULL)
		{
			lineside = 0;
			CurSector = in->d.line->frontsector;
		}
		else
		{
			lineside = P_PointOnLineSide(Start, in->d.line);
			CurSector = lineside ? in->d.line->backsector : in->d.line->frontsector;
		}
	}

	if (!(in->d.line->flags & ML_TWOSIDED))
	{
		entersector = NULL;
	}
	else
	{
		entersector = (lineside == 0) ? in->d.line->backsector : in->d.line->frontsector;

		// For backwards compatibility: Ignore lines with the same sector on both sides.
		// This is the way Doom.exe did it and some WADs (e.g. Alien Vendetta MAP15) need it.
		if (i_compatflags & COMPATF_TRACE && in->d.line->backsector == in->d.line->frontsector)
		{
			// We must check special activation here because the code below is never reached.
			if (TraceFlags & TRACE_PCross)
			{
				P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_PCross);
			}
			if (TraceFlags & TRACE_Impact)
			{
				P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
			}
			return true;
		}
	}

	ff = CurSector->floorplane.ZatPoint(hit);
	fc = CurSector->ceilingplane.ZatPoint(hit);

	if (entersector != NULL)
	{
		bf = entersector->floorplane.ZatPoint(hit);
		bc = entersector->ceilingplane.ZatPoint(hit);
	}

	sector_t *hsec = CurSector->GetHeightSec();
	if (Results->CrossedWater == NULL &&
		hsec != NULL &&
		Start.Z > hsec->floorplane.ZatPoint(Start) &&
		hit.Z <= hsec->floorplane.ZatPoint(hit))
	{
		// hit crossed a water plane
		if (CheckSectorPlane(hsec, true))
		{
			Results->CrossedWater = &sectors[CurSector->sectornum];
			Results->CrossedWaterPos = Results->HitPos;
			Results->Distance = 0;
		}
	}

	if (hit.Z <= ff)
	{
		// hit floor in front of wall
		Results->HitType = TRACE_HitFloor;
		Results->HitTexture = CurSector->GetTexture(sector_t::floor);
	}
	else if (hit.Z >= fc)
	{
		// hit ceiling in front of wall
		Results->HitType = TRACE_HitCeiling;
		Results->HitTexture = CurSector->GetTexture(sector_t::ceiling);
	}
	else if (entersector == NULL ||
		hit.Z < bf || hit.Z > bc ||
		in->d.line->flags & WallMask)
	{
		// hit the wall
		Results->HitType = TRACE_HitWall;
		Results->Tier =
			entersector == NULL ? TIER_Middle :
			hit.Z <= bf ? TIER_Lower :
			hit.Z >= bc ? TIER_Upper : TIER_Middle;
		if (TraceFlags & TRACE_Impact)
		{
			P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
		}
	}
	else
	{ 	// made it past the wall
		// check for 3D floors first
		if (entersector->e->XFloor.ffloors.Size())
		{
			memcpy(&DummySector[sectorsel], entersector, sizeof(sector_t));
			entersector = &DummySector[sectorsel];
			sectorsel ^= 1;

			for (auto rover : entersector->e->XFloor.ffloors)
			{
				int entershootthrough = !!(rover->flags&FF_SHOOTTHROUGH);

				if (entershootthrough != inshootthrough && rover->flags&FF_EXISTS)
				{
					double ff_bottom = rover->bottom.plane->ZatPoint(hit);
					double ff_top = rover->top.plane->ZatPoint(hit);

					// clip to the part of the sector we are in
					if (hit.Z > ff_top)
					{
						// 3D floor height is the same as the floor height. We need to test a second spot to see if it is above or below
						if (fabs(bf - ff_top) < EQUAL_EPSILON)
						{
							double cf = entersector->floorplane.ZatPoint(entersector->centerspot);
							double ffc = rover->top.plane->ZatPoint(entersector->centerspot);
							if (ffc > cf)
							{
								bf = ff_top - EQUAL_EPSILON;
							}
						}
						
						// above
						if (bf < ff_top)
						{
							entersector->floorplane = *rover->top.plane;
							entersector->SetTexture(sector_t::floor, *rover->top.texture, false);
							entersector->ClearPortal(sector_t::floor);
							bf = ff_top;
						}
					}
					else if (hit.Z < ff_bottom)
					{
						// 3D floor height is the same as the ceiling height. We need to test a second spot to see if it is above or below
						if (fabs(bc - ff_bottom) < EQUAL_EPSILON)
						{
							double cc = entersector->ceilingplane.ZatPoint(entersector->centerspot);
							double fcc = rover->bottom.plane->ZatPoint(entersector->centerspot);
							if (fcc < cc)
							{
								bc = ff_bottom + EQUAL_EPSILON;
							}
						}

						//below
						if (bc > ff_bottom)
						{
							entersector->ceilingplane = *rover->bottom.plane;
							entersector->SetTexture(sector_t::ceiling, *rover->bottom.texture, false);
							entersector->ClearPortal(sector_t::ceiling);
							bc = ff_bottom;
						}
					}
					else
					{
						//hit the edge - equivalent to hitting the wall
						Results->HitType = TRACE_HitWall;
						Results->Tier = TIER_FFloor;
						Results->ffloor = rover;
						if ((TraceFlags & TRACE_Impact) && in->d.line->special)
						{
							P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
						}
						goto cont;
					}
				}
			}
		}

		Results->HitType = TRACE_HitNone;
		if (TraceFlags & TRACE_PCross)
		{
			P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_PCross);
		}
		if (TraceFlags & TRACE_Impact)
		{ // This is incorrect for "impact", but Hexen did this, so
		  // we need to as well, for compatibility
			P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
		}
	}
cont:

	if (Results->HitType != TRACE_HitNone)
	{
		// We hit something, so figure out where exactly
		Results->Sector = &sectors[CurSector->sectornum];

		if (Results->HitType != TRACE_HitWall &&
			!CheckSectorPlane(CurSector, Results->HitType == TRACE_HitFloor))
		{ // trace is parallel to the plane (or right on it)
			if (entersector == NULL)
			{
				Results->HitType = TRACE_HitWall;
				Results->Tier = TIER_Middle;
			}
			else
			{
				if (hit.Z <= bf || hit.Z >= bc)
				{
					Results->HitType = TRACE_HitWall;
					Results->Tier =
						hit.Z <= bf ? TIER_Lower :
						hit.Z >= bc ? TIER_Upper : TIER_Middle;
				}
				else
				{
					Results->HitType = TRACE_HitNone;
				}
			}
			if (Results->HitType == TRACE_HitWall && TraceFlags & TRACE_Impact)
			{
				P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
			}
		}

		if (Results->HitType == TRACE_HitWall)
		{
			Results->HitPos = hit;
			SetSourcePosition();
			Results->Distance = dist;
			Results->Fraction = in->frac;
			Results->Line = in->d.line;
			Results->Side = lineside;
		}
	}

	if (TraceCallback != NULL && Results->HitType != TRACE_HitNone)
	{
		switch (TraceCallback(*Results, TraceCallbackData))
		{
		case TRACE_Stop:	return false;
		case TRACE_Abort:	Results->HitType = TRACE_HitNone; return false;
		case TRACE_Skip:	Results->HitType = TRACE_HitNone; break;
		default:			break;
		}
	}

	if (Results->HitType == TRACE_HitNone)
	{
		CurSector = entersector;
		EnterDist = dist;
		return true;
	}
	else
	{
		return false;
	}
}